

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::previousNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  int iVar1;
  uint uVar2;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte local_69;
  MemoryManager *local_68;
  DOMDocumentImpl *local_58;
  DOMNodeIteratorImpl *local_38;
  DOMNode *result;
  DOMNode *node_local;
  DOMNodeIteratorImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      local_68 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fDocument == (DOMDocument *)0x0) {
        local_58 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_58 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      local_68 = DOMDocumentImpl::getMemoryManager(local_58);
    }
    DOMException::DOMException(this_00,0xb,0,local_68);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (node == this->fRoot) {
    this_local = (DOMNodeIteratorImpl *)0x0;
  }
  else {
    iVar1 = (*node->_vptr_DOMNode[9])();
    local_38 = (DOMNodeIteratorImpl *)CONCAT44(extraout_var,iVar1);
    if (local_38 == (DOMNodeIteratorImpl *)0x0) {
      iVar1 = (*node->_vptr_DOMNode[5])();
      this_local = (DOMNodeIteratorImpl *)CONCAT44(extraout_var_00,iVar1);
    }
    else {
      uVar2 = (*(local_38->super_DOMNodeIterator)._vptr_DOMNodeIterator[0x12])();
      if ((uVar2 & 1) != 0) {
        do {
          if ((this->fExpandEntityReferences & 1U) == 0) {
            iVar1 = (*(local_38->super_DOMNodeIterator)._vptr_DOMNodeIterator[4])();
            local_69 = 0;
            if (iVar1 != 5) goto LAB_00305a79;
          }
          else {
LAB_00305a79:
            iVar1 = (*(local_38->super_DOMNodeIterator)._vptr_DOMNodeIterator[0x12])();
            local_69 = (byte)iVar1;
          }
          if ((local_69 & 1) == 0) break;
          iVar1 = (*(local_38->super_DOMNodeIterator)._vptr_DOMNodeIterator[8])();
          local_38 = (DOMNodeIteratorImpl *)CONCAT44(extraout_var_01,iVar1);
        } while( true );
      }
      this_local = local_38;
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::previousNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    DOMNode* result = 0;

    // if we're at the root, return 0.
    if (node == fRoot)
			return 0;

    // get sibling
    result = node->getPreviousSibling();
    if (!result) {
        //if 1st sibling, return parent
        result = node->getParentNode();
        return result;
    }

    // if sibling has children, keep getting last child of child.
    if (result->hasChildNodes()) {
        while ((fExpandEntityReferences || result->getNodeType()!=DOMNode::ENTITY_REFERENCE_NODE) &&
               result->hasChildNodes()) {
            result = result->getLastChild();
        }
    }

    return result;
}